

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPTrainClient.cpp
# Opt level: O2

int __thiscall
tiger::trains::client::TCPTrainClient::getCoordinate(TCPTrainClient *this,CoordsMap *coordsMap)

{
  int iVar1;
  ssize_t sVar2;
  Writer *this_00;
  string *log;
  size_t in_RCX;
  void *__buf;
  int in_R8D;
  unique_ptr<tiger::trains::network::ResposeMessage,_std::default_delete<tiger::trains::network::ResposeMessage>_>
  message;
  undefined8 local_a8;
  char local_a0 [16];
  Writer local_90;
  
  local_a8 = 0x100000000a;
  builtin_strncpy(local_a0,"{\n \"layer\": 10\n}",0x10);
  iVar1 = (int)&local_a8;
  sVar2 = network::TCPSession::send(&this->tcpSession,iVar1,(void *)0x18,in_RCX,in_R8D);
  if ((char)sVar2 == '\0') {
    iVar1 = 8;
  }
  else {
    message._M_t.
    super___uniq_ptr_impl<tiger::trains::network::ResposeMessage,_std::default_delete<tiger::trains::network::ResposeMessage>_>
    ._M_t.
    super__Tuple_impl<0UL,_tiger::trains::network::ResposeMessage_*,_std::default_delete<tiger::trains::network::ResposeMessage>_>
    .super__Head_base<0UL,_tiger::trains::network::ResposeMessage_*,_false>._M_head_impl =
         (__uniq_ptr_data<tiger::trains::network::ResposeMessage,_std::default_delete<tiger::trains::network::ResposeMessage>,_true,_true>
          )network::TCPSession::recv(&this->tcpSession,iVar1,__buf,in_RCX,in_R8D);
    iVar1 = *(int *)message._M_t.
                    super___uniq_ptr_impl<tiger::trains::network::ResposeMessage,_std::default_delete<tiger::trains::network::ResposeMessage>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_tiger::trains::network::ResposeMessage_*,_std::default_delete<tiger::trains::network::ResposeMessage>_>
                    .super__Head_base<0UL,_tiger::trains::network::ResposeMessage_*,_false>.
                    _M_head_impl;
    if (iVar1 == 0) {
      el::Logger::info<char[15],char*>
                (this->logger," %v\n %v",(char (*) [15])"Coordinate Map",
                 (char **)((long)message._M_t.
                                 super___uniq_ptr_impl<tiger::trains::network::ResposeMessage,_std::default_delete<tiger::trains::network::ResposeMessage>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_tiger::trains::network::ResposeMessage_*,_std::default_delete<tiger::trains::network::ResposeMessage>_>
                                 .
                                 super__Head_base<0UL,_tiger::trains::network::ResposeMessage_*,_false>
                                 ._M_head_impl + 0x10));
      iVar1 = convertors::json::ModelConvertor::readCoordsMap
                        (&this->convertor,
                         *(char **)((long)message._M_t.
                                          super___uniq_ptr_impl<tiger::trains::network::ResposeMessage,_std::default_delete<tiger::trains::network::ResposeMessage>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_tiger::trains::network::ResposeMessage_*,_std::default_delete<tiger::trains::network::ResposeMessage>_>
                                          .
                                          super__Head_base<0UL,_tiger::trains::network::ResposeMessage_*,_false>
                                          ._M_head_impl + 0x10),
                         *(int *)((long)message._M_t.
                                        super___uniq_ptr_impl<tiger::trains::network::ResposeMessage,_std::default_delete<tiger::trains::network::ResposeMessage>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_tiger::trains::network::ResposeMessage_*,_std::default_delete<tiger::trains::network::ResposeMessage>_>
                                        .
                                        super__Head_base<0UL,_tiger::trains::network::ResposeMessage_*,_false>
                                        ._M_head_impl + 8),coordsMap);
      if (iVar1 == 0) {
        iVar1 = 0;
      }
      else {
        local_90._vptr_Writer = (_func_int **)&PTR__Writer_0019ac58;
        local_90.m_level = Error;
        local_90.m_file =
             "/workspace/llm4binary/github/license_all_cmakelists_25/BrychDaneel[P]WgForgeTrains/src/client/TCPTrainClient.cpp"
        ;
        local_90.m_line = 0xeb;
        local_90.m_func =
             "virtual int tiger::trains::client::TCPTrainClient::getCoordinate(models::CoordsMap *)"
        ;
        local_90.m_verboseLevel = 0;
        local_90.m_logger = (Logger *)0x0;
        local_90.m_proceed = false;
        local_90.m_messageBuilder.m_logger = (Logger *)0x0;
        local_90.m_messageBuilder.m_containerLogSeperator = "";
        local_90.m_dispatchAction = NormalLog;
        local_90.m_loggerIds.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_90.m_loggerIds.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_90.m_loggerIds.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        this_00 = el::base::Writer::construct(&local_90,1,"default");
        log = convertors::json::ModelConvertor::getLastErrorMessage_abi_cxx11_(&this->convertor);
        el::base::Writer::operator<<(this_00,log);
        el::base::Writer::~Writer(&local_90);
        iVar1 = 6;
      }
    }
    std::
    unique_ptr<tiger::trains::network::ResposeMessage,_std::default_delete<tiger::trains::network::ResposeMessage>_>
    ::~unique_ptr(&message);
  }
  return iVar1;
}

Assistant:

int TCPTrainClient::getCoordinate(models::CoordsMap *coordsMap)
{
    char buffer[BUFF_SIZE] = "{\n \"layer\": 10\n}";
    size_t len = strlen(buffer);

    char sendBuffer[8+len];
    uint32_t cmd = 10;

    memcpy(sendBuffer, &cmd, OFFSET_SIZE);
    memcpy(sendBuffer + OFFSET_1, &len, OFFSET_SIZE);
    memcpy(sendBuffer + OFFSET_2, buffer, len);

    if (!tcpSession.send(sendBuffer, len + OFFSET_2))
        return (int)TCPTrainClient::ErrorType::NOT_SEND;


    std::unique_ptr<network::ResposeMessage> message(tcpSession.recv());

    if (message == nullptr || message->result != 0)
        return message->result;


    logger->info(" %v\n %v", "Coordinate Map", message->data);

    int retVal = convertor.readCoordsMap(message->data, message->dataLength, coordsMap);


    if (retVal != 0)
    {
        LOG(ERROR) << convertor.getLastErrorMessage();
        return (int)TCPTrainClient::ErrorType::JSON_NO_PARSE;
    }

    return (int)TCPTrainClient::ErrorType::OKEY;


}